

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int fits_make_hist(fitsfile *fptr,fitsfile *histptr,int bitpix,int naxis,long *naxes,int *colnum,
                  float *amin,float *amax,float *binsize,float weight,int wtcolnum,int recip,
                  char *selectrow,int *status)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  double binsized [4];
  double amaxd [4];
  double amind [4];
  
  iVar1 = *status;
  if (iVar1 == 0) {
    uVar3 = 4;
    if (naxis < 4) {
      uVar3 = naxis;
    }
    uVar2 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      amind[uVar2] = (double)amin[uVar2];
      amaxd[uVar2] = (double)amax[uVar2];
      binsized[uVar2] = (double)binsize[uVar2];
    }
    fits_make_histd(fptr,histptr,bitpix,naxis,naxes,colnum,amind,amaxd,binsized,(double)weight,
                    wtcolnum,recip,selectrow,status);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int fits_make_hist(fitsfile *fptr, /* IO - pointer to table with X and Y cols; */
    fitsfile *histptr, /* I - pointer to output FITS image      */
    int bitpix,       /* I - datatype for image: 16, 32, -32, etc    */
    int naxis,        /* I - number of axes in the histogram image   */
    long *naxes,      /* I - size of axes in the histogram image   */
    int *colnum,    /* I - column numbers (array length = naxis)   */
    float *amin,     /* I - minimum histogram value, for each axis */
    float *amax,     /* I - maximum histogram value, for each axis */
    float *binsize, /* I - bin size along each axis               */
    float weight,        /* I - binning weighting factor          */
    int wtcolnum, /* I - optional keyword or col for weight*/
    int recip,              /* I - use reciprocal of the weight?     */
    char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
    int *status)
{		  
  double amind[4], amaxd[4], binsized[4], weightd;

  /* Copy single precision values into double precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amind[i] = (double) amin[i];
      amaxd[i] = (double) amax[i];
      binsized[i] = (double) binsize[i];
    }

    weightd = (double) weight;

    fits_make_histd(fptr, histptr, bitpix, naxis, naxes, colnum,
		    amind, amaxd, binsized, weight, wtcolnum, recip,
		    selectrow, status);
  }

  return (*status);
}